

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void Js::InterpreterStackFrame::TraceAsmJsOpCode(InterpreterStackFrame *that,OpCodeAsmJs op)

{
  bool bVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  char16 *pcVar4;
  
  uVar2 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  LVar3 = FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(that + 0x88));
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,AsmjsInterpreterPhase,uVar2,LVar3);
  if (bVar1) {
    uVar2 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
    LVar3 = FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(that + 0x88));
    pcVar4 = OpCodeUtilAsmJs::GetOpCodeName(op);
    Output::Print(L"%d.%d:Executing %s at offset 0x%X\n",(ulong)uVar2,(ulong)LVar3,pcVar4,
                  *(undefined8 *)(that + 0x108));
    return;
  }
  return;
}

Assistant:

void InterpreterStackFrame::TraceAsmJsOpCode(InterpreterStackFrame* that, Js::OpCodeAsmJs op)
    {
#if DBG_DUMP && defined(ASMJS_PLAT)
        if (PHASE_TRACE(Js::AsmjsInterpreterPhase, that->m_functionBody))
        {
            Output::Print(_u("%d.%d:Executing %s at offset 0x%X\n"), that->m_functionBody->GetSourceContextId(), that->m_functionBody->GetLocalFunctionId(), Js::OpCodeUtilAsmJs::GetOpCodeName(op), that->DEBUG_currentByteOffset);
        }
#endif
    }